

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOnSelf<phmap::flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>_>
::TestBody(AssignmentOnSelf<phmap::flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>_>
           *this)

{
  mt19937_64 *pmVar1;
  flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  *s;
  char *message;
  AssertionResult gtest_ar;
  TypeParam m;
  allocator_type local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  void *local_b0;
  undefined8 uStack_a8;
  long local_a0;
  undefined4 local_98;
  void *local_90;
  undefined8 uStack_88;
  long local_80;
  result_type_conflict1 local_74;
  result_type_conflict1 local_70;
  result_type_conflict1 local_6c;
  result_type_conflict1 local_68;
  result_type_conflict1 local_64;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  local_60;
  
  local_60.ctrl_ = (ctrl_t *)0x7fffffff00000000;
  pmVar1 = hash_internal::GetSharedRng();
  local_74 = std::uniform_int_distribution<int>::operator()
                       ((uniform_int_distribution<int> *)&local_60,pmVar1,(param_type *)&local_60);
  local_60.ctrl_ = (ctrl_t *)0x7fffffff00000000;
  pmVar1 = hash_internal::GetSharedRng();
  local_70 = std::uniform_int_distribution<int>::operator()
                       ((uniform_int_distribution<int> *)&local_60,pmVar1,(param_type *)&local_60);
  local_60.ctrl_ = (ctrl_t *)0x7fffffff00000000;
  pmVar1 = hash_internal::GetSharedRng();
  local_6c = std::uniform_int_distribution<int>::operator()
                       ((uniform_int_distribution<int> *)&local_60,pmVar1,(param_type *)&local_60);
  local_60.ctrl_ = (ctrl_t *)0x7fffffff00000000;
  pmVar1 = hash_internal::GetSharedRng();
  local_68 = std::uniform_int_distribution<int>::operator()
                       ((uniform_int_distribution<int> *)&local_60,pmVar1,(param_type *)&local_60);
  local_60.ctrl_ = (ctrl_t *)0x7fffffff00000000;
  pmVar1 = hash_internal::GetSharedRng();
  local_64 = std::uniform_int_distribution<int>::operator()
                       ((uniform_int_distribution<int> *)&local_60,pmVar1,(param_type *)&local_60);
  local_b8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
           next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl;
  local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_e0.id_ = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (pointer)((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
                       next_id<phmap::priv::StatefulTestingEqual>()::gId + 1);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
  ::raw_hash_set<int_const*>
            ((raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
              *)&local_60,&local_74,(int *)&local_60,0,(hasher *)&local_b8,(key_equal *)&local_d0,
             &local_e0);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::operator=(&local_60,&local_60);
  local_98 = 3;
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_90,&local_74,(int *)&local_60,
             (allocator_type *)&local_d0);
  local_a0 = local_80;
  uStack_a8 = uStack_88;
  local_b0 = local_90;
  local_90 = (void *)0x0;
  uStack_88 = 0;
  local_80 = 0;
  local_b8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_98;
  keys<phmap::flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>>
            (&local_d0,(priv *)&local_60,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>::
  operator()(&local_e0,(char *)&local_b8,(vector<int,_std::allocator<int>_> *)"keys(m)");
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0 != (void *)0x0) {
    operator_delete(local_b0,local_a0 - (long)local_b0);
  }
  if (local_90 != (void *)0x0) {
    operator_delete(local_90,local_80 - (long)local_90);
  }
  if ((char)local_e0.id_ == '\0') {
    testing::Message::Message((Message *)&local_b8);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x1dc,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_b8._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_b8._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::destroy_slots(&local_60);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOnSelf) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m(values);
  m = *&m;  // Avoid -Wself-assign.
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAreArray(values));
}